

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_d960c9::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator_type local_79;
  _Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_78;
  Input local_60;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  local_60.type = Up;
  local_60.info = (Info)0x0;
  local_50 = 1;
  local_48 = 0;
  local_40 = 2;
  local_38 = 0;
  local_30 = 3;
  local_28 = 0;
  local_20 = 6;
  local_18 = 0;
  __l._M_len = 5;
  __l._M_array = &local_60;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            ((vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_78,
             __l,&local_79);
  Inputs::ConcreteJoystick::ConcreteJoystick
            (&this->super_ConcreteJoystick,
             (vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_78)
  ;
  std::_Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::
  ~_Vector_base(&local_78);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_0058b950;
  this->kempston_ = '\0';
  this->sinclair_ = 0xffff;
  return;
}

Assistant:

Joystick() :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}) {}